

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void unicodeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  u32 uVar1;
  uchar *z;
  uchar *local_18;
  
  local_18 = (uchar *)sqlite3ValueText(*argv,'\x01');
  if ((local_18 != (uchar *)0x0) && (*local_18 != '\0')) {
    uVar1 = sqlite3Utf8Read(&local_18);
    sqlite3VdbeMemRelease(&context->s);
    (context->s).u = (anon_union_8_5_44880d43_for_u)(long)(int)uVar1;
    (context->s).flags = 4;
    (context->s).type = '\x01';
  }
  return;
}

Assistant:

static void unicodeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *z = sqlite3_value_text(argv[0]);
  (void)argc;
  if( z && z[0] ) sqlite3_result_int(context, sqlite3Utf8Read(&z));
}